

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall
CLIntercept::chromeCallLoggingExit
          (CLIntercept *this,char *functionName,string *tag,bool includeId,uint64_t enqueueCounter,
          time_point tickStart,time_point tickEnd)

{
  _Rb_tree_header *p_Var1;
  CChromeTracer *this_00;
  uint32_t threadNumber;
  int iVar2;
  mapped_type *pmVar3;
  undefined8 uVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  ulong threadId;
  mutex *__mutex;
  uint64_t startTime;
  uint64_t delta;
  uint64_t local_38;
  
  __mutex = &this->m_Mutex;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    iVar2 = gettid();
    threadId = (ulong)iVar2;
    p_Var1 = &(this->m_ThreadNumberMap)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = (this->m_ThreadNumberMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var5 = &p_Var1->_M_header;
    for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[*(ulong *)(p_Var6 + 1) < threadId])
    {
      if (*(ulong *)(p_Var6 + 1) >= threadId) {
        p_Var5 = p_Var6;
      }
    }
    p_Var6 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
       (p_Var6 = p_Var5, threadId < *(ulong *)(p_Var5 + 1))) {
      p_Var6 = &p_Var1->_M_header;
    }
    local_38 = threadId;
    if ((_Rb_tree_header *)p_Var6 == p_Var1) {
      threadNumber = (uint32_t)
                     (this->m_ThreadNumberMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      pmVar3 = std::
               map<unsigned_long,_unsigned_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
               ::operator[](&this->m_ThreadNumberMap,&local_38);
      *pmVar3 = threadNumber;
      if ((this->m_Config).ChromeCallLogging == true) {
        CChromeTracer::addThreadMetadata(&this->m_ChromeTrace,local_38,threadNumber);
      }
    }
    delta = (long)tickEnd.__d.__r - (long)tickStart.__d.__r;
    this_00 = &this->m_ChromeTrace;
    startTime = (long)tickStart.__d.__r - (this->m_StartTime).__d.__r;
    if (includeId && tag->_M_string_length != 0) {
      CChromeTracer::addCallLogging
                (this_00,functionName,tag,threadId,startTime,delta,enqueueCounter);
    }
    else if (tag->_M_string_length == 0) {
      if (includeId) {
        CChromeTracer::addCallLogging(this_00,functionName,threadId,startTime,delta,enqueueCounter);
      }
      else {
        CChromeTracer::addCallLogging(this_00,functionName,threadId,startTime,delta);
      }
    }
    else {
      CChromeTracer::addCallLogging(this_00,functionName,tag,threadId,startTime,delta);
    }
    if ((this->m_Config).FlushFiles == true) {
      CChromeTracer::flush(this_00);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar4 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar4);
}

Assistant:

void CLIntercept::chromeCallLoggingExit(
    const char* functionName,
    const std::string& tag,
    bool includeId,
    const uint64_t enqueueCounter,
    clock::time_point tickStart,
    clock::time_point tickEnd )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    uint64_t    threadId = OS().GetThreadID();

    // This will name the thread if it is not named already.
    getThreadNumber( threadId );

    using ns = std::chrono::nanoseconds;
    uint64_t    nsStart =
        std::chrono::duration_cast<ns>(tickStart - m_StartTime).count();
    uint64_t    nsDelta =
        std::chrono::duration_cast<ns>(tickEnd - tickStart).count();

    if( !tag.empty() && includeId )
    {
        m_ChromeTrace.addCallLogging( functionName, tag, threadId, nsStart, nsDelta, enqueueCounter );
    }
    else if( !tag.empty() )
    {
        m_ChromeTrace.addCallLogging( functionName, tag, threadId, nsStart, nsDelta );
    }
    else if( includeId )
    {
        m_ChromeTrace.addCallLogging( functionName, threadId, nsStart, nsDelta, enqueueCounter );
    }
    else
    {
        m_ChromeTrace.addCallLogging( functionName, threadId, nsStart, nsDelta );
    }

    if( m_Config.FlushFiles )
    {
        m_ChromeTrace.flush();
    }
}